

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void P_GetFloorCeilingZ(FCheckPosition *tmf,int flags)

{
  sector_t *this;
  int iVar1;
  subsector_t *psVar2;
  FTextureID *pFVar3;
  AActor *pAVar4;
  sector_t *this_00;
  double dVar5;
  F3DFloor *ffc;
  F3DFloor *fff;
  F3DFloor *local_38;
  F3DFloor *local_30;
  
  if (((flags & 2U) == 0) || (pAVar4 = tmf->thing, pAVar4->Sector == (sector_t *)0x0)) {
    psVar2 = P_PointInSubsector((tmf->pos).X,(tmf->pos).Y);
    pAVar4 = tmf->thing;
  }
  else {
    psVar2 = (subsector_t *)&tmf->sector;
  }
  this = psVar2->sector;
  dVar5 = (tmf->pos).Z;
  dVar5 = sector_t::NextHighestCeilingAt
                    (this,(tmf->pos).X,(tmf->pos).Y,dVar5,pAVar4->Height + dVar5,flags,
                     &tmf->ceilingsector,&local_38);
  tmf->ceilingz = dVar5;
  dVar5 = sector_t::NextLowestFloorAt
                    (this,(tmf->pos).X,(tmf->pos).Y,(tmf->pos).Z,flags,tmf->thing->MaxStepHeight,
                     &tmf->floorsector,&local_30);
  tmf->dropoffz = dVar5;
  tmf->floorz = dVar5;
  if (local_30 == (F3DFloor *)0x0) {
    this_00 = tmf->floorsector;
    (tmf->floorpic).texnum = this_00->planes[0].Texture.texnum;
    iVar1 = 0;
  }
  else {
    (tmf->floorpic).texnum = ((local_30->top).texture)->texnum;
    this_00 = local_30->model;
    iVar1 = (local_30->top).isceiling;
  }
  iVar1 = sector_t::GetTerrain(this_00,iVar1);
  tmf->floorterrain = iVar1;
  if (local_38 == (F3DFloor *)0x0) {
    pFVar3 = &tmf->ceilingsector->planes[1].Texture;
  }
  else {
    pFVar3 = (local_38->bottom).texture;
  }
  (tmf->ceilingpic).texnum = pFVar3->texnum;
  tmf->sector = this;
  return;
}

Assistant:

void P_GetFloorCeilingZ(FCheckPosition &tmf, int flags)
{
	sector_t *sec = (!(flags & FFCF_SAMESECTOR) || tmf.thing->Sector == NULL)? P_PointInSector(tmf.pos) : tmf.sector;
	F3DFloor *ffc, *fff;

	tmf.ceilingz = sec->NextHighestCeilingAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, tmf.pos.Z + tmf.thing->Height, flags, &tmf.ceilingsector, &ffc);
	tmf.floorz = tmf.dropoffz = sec->NextLowestFloorAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, flags, tmf.thing->MaxStepHeight, &tmf.floorsector, &fff);

	if (fff)
	{
		tmf.floorpic = *fff->top.texture;
		tmf.floorterrain = fff->model->GetTerrain(fff->top.isceiling);
	}
	else
	{
		tmf.floorpic = tmf.floorsector->GetTexture(sector_t::floor);
		tmf.floorterrain = tmf.floorsector->GetTerrain(sector_t::floor);
	}
	tmf.ceilingpic = ffc ? *ffc->bottom.texture : tmf.ceilingsector->GetTexture(sector_t::ceiling);
	tmf.sector = sec;

}